

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RenderSingleLineRasterAtProperPosition(RendererTests *this)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  cell *pcVar4;
  cell *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  scanline_cells sVar9;
  allocator local_1a9;
  scanline_mockup local_1a8;
  mask<8UL> mask2;
  LocationInfo local_158;
  string local_130;
  mask<8UL> mask1;
  span reference2 [2];
  span reference1 [2];
  scanline_cells cells2 [1];
  scanline_cells cells1 [1];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  cell local_64;
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  local_1a8.excepted_y = -1000000;
  local_1a8.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1a8.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1a8.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1a8._25_8_ = 0;
  local_1a8._current_y = 0x7fffffff;
  cells1[0].second = (cell *)&stack0xffffffffffffffcc;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_48 = 0;
  uStack_3c = 0;
  local_58._8_8_ = 0xb00000011;
  uStack_44 = 0xfffffffd;
  uStack_40 = 0xd;
  local_38 = 0xfffffff2;
  cells1[0].first = (cell *)local_58;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<8ul> *)&mask1,&cells1,0xd);
  iVar7 = mask1._min_y;
  do {
    if (mask1._height + mask1._min_y <= iVar7) {
      reference1[1].y = 0xd;
      reference1[1].x = 0xb;
      reference1[1].length = 2;
      reference1[1].cover = 0x1c00;
      reference1[0].y = 0xd;
      reference1[0].x = 0;
      reference1[0].length = 0xb;
      reference1[0].cover = 0x2200;
      std::__cxx11::string::string
                ((string *)&local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,(allocator *)local_88);
      ut::LocationInfo::LocationInfo((LocationInfo *)&mask2,&local_158.filename,0x170);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                (&reference1,&local_1a8.spans_log,(LocationInfo *)&mask2);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      cells2[0].second = &local_64;
      local_78 = 0;
      uStack_6c = 0;
      local_88._0_4_ = 2;
      local_88._4_4_ = 0;
      local_88._8_8_ = 0xa00000011;
      uStack_74 = 0xfffffffd;
      uStack_70 = 0xb;
      local_68 = 0xfffffff2;
      cells2[0].first = (cell *)local_88;
      mocks::mask<8ul>::
      mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
                ((mask<8ul> *)&mask2,&cells2,-0x83);
      local_1a8.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
           SUB81(local_1a8.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,0);
      local_1a8.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
           (undefined7)
           ((ulong)local_1a8.spans_log.
                   super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 8);
      iVar7 = mask2._min_y;
      do {
        if (mask2._height + mask2._min_y <= iVar7) {
          reference2[1].y = -0x83;
          reference2[1].x = 10;
          reference2[1].length = 1;
          reference2[1].cover = 0x1c00;
          reference2[0].y = -0x83;
          reference2[0].x = 2;
          reference2[0].length = 8;
          reference2[0].cover = 0x2200;
          std::__cxx11::string::string
                    ((string *)&local_130,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,&local_1a9);
          ut::LocationInfo::LocationInfo(&local_158,&local_130,0x182);
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    (&reference2,&local_1a8.spans_log,&local_158);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::
          _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
          ::~_Vector_base(&mask2._cells.
                           super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                         );
          std::
          _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
          ::~_Vector_base(&mask1._cells.
                           super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                         );
          anon_unknown_1::scanline_mockup::~scanline_mockup(&local_1a8);
          return;
        }
        sVar9 = mocks::mask<8UL>::operator[](&mask2,iVar7);
        pcVar5 = sVar9.second;
        pcVar4 = sVar9.first;
        bVar2 = anon_unknown_1::scanline_mockup::begin(&local_1a8,iVar7);
        if (bVar2) {
          if (pcVar4 != pcVar5) {
            uVar8 = 0;
LAB_0017fc3b:
            iVar6 = pcVar4->x;
            iVar3 = 0;
            pcVar1 = pcVar4;
            do {
              pcVar4 = pcVar1 + 1;
              iVar3 = iVar3 + pcVar1->area;
              uVar8 = uVar8 + pcVar1->cover;
              if (pcVar4 == pcVar5) break;
              pcVar1 = pcVar4;
            } while (pcVar4->x == iVar6);
            if (iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_cell(&local_1a8,iVar6,uVar8 * 0x200 - iVar3);
              iVar6 = iVar6 + 1;
            }
            if (pcVar4 != pcVar5) {
              iVar3 = pcVar4->x - iVar6;
              if ((uVar8 & 0x7fffff) != 0 && iVar3 != 0) {
                anon_unknown_1::scanline_mockup::add_span(&local_1a8,iVar6,iVar3,uVar8 * 0x200);
              }
              goto LAB_0017fc3b;
            }
          }
          anon_unknown_1::scanline_mockup::commit(&local_1a8);
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    sVar9 = mocks::mask<8UL>::operator[](&mask1,iVar7);
    pcVar5 = sVar9.second;
    pcVar4 = sVar9.first;
    bVar2 = anon_unknown_1::scanline_mockup::begin(&local_1a8,iVar7);
    if (bVar2) {
      if (pcVar4 != pcVar5) {
        uVar8 = 0;
LAB_0017fa87:
        iVar6 = pcVar4->x;
        iVar3 = 0;
        pcVar1 = pcVar4;
        do {
          pcVar4 = pcVar1 + 1;
          iVar3 = iVar3 + pcVar1->area;
          uVar8 = uVar8 + pcVar1->cover;
          if (pcVar4 == pcVar5) break;
          pcVar1 = pcVar4;
        } while (pcVar4->x == iVar6);
        if (iVar3 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_1a8,iVar6,uVar8 * 0x200 - iVar3);
          iVar6 = iVar6 + 1;
        }
        if (pcVar4 != pcVar5) {
          iVar3 = pcVar4->x - iVar6;
          if ((uVar8 & 0x7fffff) != 0 && iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_span(&local_1a8,iVar6,iVar3,uVar8 * 0x200);
          }
          goto LAB_0017fa87;
        }
      }
      anon_unknown_1::scanline_mockup::commit(&local_1a8);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}